

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixDir_Open(char *zPath,jx9_value *pResource,void **ppHandle)

{
  int iVar1;
  DIR *pDVar2;
  
  pDVar2 = opendir(zPath);
  if (pDVar2 == (DIR *)0x0) {
    iVar1 = -1;
  }
  else {
    *ppHandle = pDVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int UnixDir_Open(const char *zPath, jx9_value *pResource, void **ppHandle)
{
	DIR *pDir;
	/* Open the target directory */
	pDir = opendir(zPath);
	if( pDir == 0 ){
		pResource = 0; /* Compiler warning */
		return -1;
	}
	/* Save our structure */
	*ppHandle = pDir;
	return JX9_OK;
}